

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O1

void __thiscall DifferentialEquation::stepEulerIto(DifferentialEquation *this)

{
  StochasticVariable *pSVar1;
  long lVar2;
  double dVar3;
  
  this->eqnIncrement = 0.0;
  if (0 < this->eqnTermAmount) {
    lVar2 = 0;
    do {
      dVar3 = (double)(**(code **)((long)((this->eqnIntegrands).
                                          super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar2]->
                                         super_StochasticProcess).super_Parametric._vptr_Parametric
                                  + 0x78))
                                ((this->super_StochasticVariable).super_StochasticProcess.
                                 stochCurrentValue);
      pSVar1 = (this->eqnIntegrators).
               super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar2];
      this->eqnIncrement =
           ((pSVar1->super_StochasticProcess).stochNextValue -
           (pSVar1->super_StochasticProcess).stochCurrentValue) * dVar3 + this->eqnIncrement;
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->eqnTermAmount);
  }
  (this->super_StochasticVariable).super_StochasticProcess.stochNextValue =
       (this->super_StochasticVariable).super_StochasticProcess.stochCurrentValue +
       this->eqnIncrement;
  return;
}

Assistant:

void DifferentialEquation::stepEulerIto()
{
	// cout << "Ito method" << endl;
	
	// calculate new diff
	eqnIncrement = 0.0;
	for(int i=0; i<eqnTermAmount; ++i) {
		double integrand = (*eqnIntegrands[i])(stochCurrentValue);
		double integrator = (*eqnIntegrators[i]).d();
		eqnIncrement +=  integrand * integrator;
	// 	cout << "integrand " << i << ": " << integrand
	// 		<< " integrator " << i << ": " << integrator << endl;
	}
	
	stochNextValue = stochCurrentValue + eqnIncrement;
	// cout << "DifferentialEquation::stochNextValue = " << stochNextValue << endl;
}